

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O0

void v_quadrature_rule(int n,double *t,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *e;
  double dVar3;
  double r8_pi;
  int i;
  double *bj;
  double *w_local;
  double *t_local;
  int n_local;
  
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    t[r8_pi._4_4_] = 0.0;
  }
  *t = 0.5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  e = (double *)operator_new__(uVar2);
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    e[r8_pi._4_4_] = 0.5;
  }
  dVar3 = sqrt(3.141592653589793);
  *w = dVar3;
  for (r8_pi._4_4_ = 1; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    w[r8_pi._4_4_] = 0.0;
  }
  imtqlx(n,t,e,w);
  for (r8_pi._4_4_ = 0; r8_pi._4_4_ < n; r8_pi._4_4_ = r8_pi._4_4_ + 1) {
    w[r8_pi._4_4_] = w[r8_pi._4_4_] * w[r8_pi._4_4_];
  }
  if (e != (double *)0x0) {
    operator_delete__(e);
  }
  return;
}

Assistant:

void v_quadrature_rule ( int n, double t[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    V_QUADRATURE_RULE: quadrature rule for V(n,x).
//
//  Discussion:
//
//    Thanks to Csaba Kertesz for pointing out some temporary memory that needed to be freed,
//    06 November 2015.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 November 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the rule.
//
//    Output, double T[N], W[N], the points and weights of the rule.
//
{
  double *bj;
  int i;
  const double r8_pi = 3.141592653589793;

  for ( i = 0; i < n; i++ )
  {
    t[i] = 0.0;
  }
  t[0] = + 0.5;

  bj = new double[n];
  for ( i = 0; i < n; i++ )
  {
    bj[i] = 0.5;
  }

  w[0] = sqrt ( r8_pi );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
  imtqlx ( n, t, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }
//
//  Free memory.
//
  delete [] bj;

  return;
}